

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_format.cpp
# Opt level: O2

void __thiscall csv::CSVFormat::assert_no_char_overlap(CSVFormat *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  iterator iVar3;
  runtime_error *this_00;
  char *__k;
  ulong uVar4;
  _Vector_base<char,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string err_msg;
  set<char,_std::less<char>,_std::allocator<char>_> trims;
  set<char,_std::less<char>,_std::allocator<char>_> delims;
  
  std::set<char,std::less<char>,std::allocator<char>>::
  set<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((set<char,std::less<char>,std::allocator<char>> *)&delims,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             (this->possible_delimiters).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             (this->possible_delimiters).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::set<char,std::less<char>,std::allocator<char>>::
  set<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((set<char,std::less<char>,std::allocator<char>> *)&trims,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             (this->trim_chars).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             (this->trim_chars).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var2 = &delims._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = &trims._M_t._M_impl.super__Rb_tree_header;
  std::
  __set_intersection<std::_Rb_tree_const_iterator<char>,std::_Rb_tree_const_iterator<char>,std::back_insert_iterator<std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (delims._M_t._M_impl.super__Rb_tree_header._M_header._M_left,p_Var2,
             trims._M_t._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1);
  __k = &this->quote_char;
  iVar3 = std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
          find(&delims._M_t,__k);
  if ((_Rb_tree_header *)iVar3._M_node == p_Var2) {
    iVar3 = std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
            ::find(&trims._M_t,__k);
    if ((_Rb_tree_header *)iVar3._M_node == p_Var1) goto LAB_00105a89;
  }
  std::vector<char,_std::allocator<char>_>::push_back
            ((vector<char,_std::allocator<char>_> *)&local_e8,__k);
LAB_00105a89:
  if (local_e8._M_impl.super__Vector_impl_data._M_start ==
      local_e8._M_impl.super__Vector_impl_data._M_finish) {
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_e8);
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    ~_Rb_tree(&trims._M_t);
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    ~_Rb_tree(&delims._M_t);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err_msg,
             "There should be no overlap between the quote character, the set of possible delimiters and the set of whitespace characters. Offending characters: "
             ,(allocator<char> *)&local_c8);
  uVar4 = 0;
  while (uVar4 < (ulong)((long)local_e8._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_e8._M_impl.super__Vector_impl_data._M_start)) {
    std::__cxx11::string::append((char *)&err_msg);
    std::__cxx11::string::push_back((char)&err_msg);
    std::__cxx11::string::append((char *)&err_msg);
    uVar4 = uVar4 + 1;
    if (uVar4 < (ulong)((long)local_e8._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_e8._M_impl.super__Vector_impl_data._M_start)) {
      std::__cxx11::string::append((char *)&err_msg);
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_c8,&err_msg,'.');
  std::runtime_error::runtime_error(this_00,(string *)&local_c8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CSV_INLINE void CSVFormat::assert_no_char_overlap()
    {
        auto delims = std::set<char>(
            this->possible_delimiters.begin(), this->possible_delimiters.end()),
            trims = std::set<char>(
                this->trim_chars.begin(), this->trim_chars.end());

        // Stores intersection of possible delimiters and trim characters
        std::vector<char> intersection = {};

        // Find which characters overlap, if any
        std::set_intersection(
            delims.begin(), delims.end(),
            trims.begin(), trims.end(),
            std::back_inserter(intersection));

        // Make sure quote character is not contained in possible delimiters
        // or whitespace characters
        if (delims.find(this->quote_char) != delims.end() ||
            trims.find(this->quote_char) != trims.end()) {
            intersection.push_back(this->quote_char);
        }

        if (!intersection.empty()) {
            std::string err_msg = "There should be no overlap between the quote character, "
                "the set of possible delimiters "
                "and the set of whitespace characters. Offending characters: ";

            // Create a pretty error message with the list of overlapping
            // characters
            for (size_t i = 0; i < intersection.size(); i++) {
                err_msg += "'";
                err_msg += intersection[i];
                err_msg += "'";

                if (i + 1 < intersection.size())
                    err_msg += ", ";
            }

            throw std::runtime_error(err_msg + '.');
        }
    }